

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

weekday absl::lts_20250127::time_internal::cctz::detail::get_weekday(civil_second *cs)

{
  ulong uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)(cs->f_).m;
  lVar3 = (cs->f_).y % 400 - (ulong)(lVar4 < 3);
  uVar1 = lVar3 + 0x960;
  uVar2 = (ushort)uVar1;
  return *(weekday *)
          (&DAT_004487c8 +
          ((long)((((uVar1 >> 2) + lVar3 + 0x960 +
                   (long)(cs->f_).d + (long)*(int *)(&DAT_004487f0 + lVar4 * 4)) -
                  (ulong)(uVar2 / 100)) + (ulong)(uVar2 / 400)) % 7) * 4);
}

Assistant:

CONSTEXPR_M int day() const noexcept { return f_.d; }